

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cpp
# Opt level: O1

mz_ulong mz_adler32(mz_ulong adler,uchar *ptr,size_t buf_len)

{
  ulong uVar1;
  ulong uVar2;
  mz_ulong mVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  
  if (ptr == (uchar *)0x0) {
    mVar3 = 1;
  }
  else {
    uVar2 = adler >> 0x10;
    uVar7 = (uint)(adler >> 0x10);
    uVar9 = adler & 0xffff;
    uVar8 = (uint)uVar9;
    if (buf_len != 0) {
      uVar1 = buf_len % 0x15b0;
      do {
        uVar11 = 0;
        uVar10 = uVar11;
        if (7 < uVar1) {
          do {
            iVar13 = (uint)ptr[uVar10] + (int)uVar9;
            iVar4 = (uint)ptr[uVar10 + 1] + iVar13;
            iVar14 = (uint)ptr[uVar10 + 2] + iVar4;
            iVar5 = (uint)ptr[uVar10 + 3] + iVar14;
            iVar15 = (uint)ptr[uVar10 + 4] + iVar5;
            iVar6 = (uint)ptr[uVar10 + 5] + iVar15;
            iVar16 = (uint)ptr[uVar10 + 6] + iVar6;
            uVar7 = (uint)ptr[uVar10 + 7] + iVar16;
            uVar9 = (ulong)uVar7;
            uVar2 = (ulong)((int)uVar2 + iVar13 + iVar4 + iVar14 + iVar5 + iVar15 + iVar6 + iVar16 +
                           uVar7);
            uVar11 = uVar10 + 8;
            iVar4 = (int)uVar10;
            uVar10 = uVar11;
          } while (iVar4 + 0xfU < (uint)uVar1);
          ptr = ptr + uVar11;
        }
        uVar7 = (uint)uVar2;
        uVar8 = (uint)uVar9;
        lVar17 = uVar1 - uVar11;
        if (uVar11 <= uVar1 && lVar17 != 0) {
          lVar12 = 0;
          do {
            uVar8 = (int)uVar9 + (uint)ptr[lVar12];
            uVar9 = (ulong)uVar8;
            uVar7 = (int)uVar2 + uVar8;
            uVar2 = (ulong)uVar7;
            lVar12 = lVar12 + 1;
          } while (lVar17 != lVar12);
          ptr = ptr + lVar17;
        }
        uVar8 = uVar8 % 0xfff1;
        uVar9 = (ulong)uVar8;
        uVar7 = uVar7 % 0xfff1;
        uVar2 = (ulong)uVar7;
        buf_len = buf_len - uVar1;
        uVar1 = 0x15b0;
      } while (buf_len != 0);
    }
    mVar3 = (mz_ulong)(uVar7 << 0x10 | uVar8);
  }
  return mVar3;
}

Assistant:

mz_ulong mz_adler32(mz_ulong adler, const unsigned char *ptr, size_t buf_len)
{
    mz_uint32 i, s1 = (mz_uint32)(adler & 0xffff), s2 = (mz_uint32)(adler >> 16);
    size_t block_len = buf_len % 5552;
    if (!ptr)
        return MZ_ADLER32_INIT;
    while (buf_len)
    {
        for (i = 0; i + 7 < block_len; i += 8, ptr += 8)
        {
            s1 += ptr[0], s2 += s1;
            s1 += ptr[1], s2 += s1;
            s1 += ptr[2], s2 += s1;
            s1 += ptr[3], s2 += s1;
            s1 += ptr[4], s2 += s1;
            s1 += ptr[5], s2 += s1;
            s1 += ptr[6], s2 += s1;
            s1 += ptr[7], s2 += s1;
        }
        for (; i < block_len; ++i)
            s1 += *ptr++, s2 += s1;
        s1 %= 65521U, s2 %= 65521U;
        buf_len -= block_len;
        block_len = 5552;
    }
    return (s2 << 16) + s1;
}